

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

int luaV_lessthan(lua_State *L,TValue *l,TValue *r)

{
  double dVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  bool bVar7;
  
  uVar6 = l->tt_ & 0xf;
  if (uVar6 == 4) {
    if ((r->tt_ & 0xfU) == 4) {
      uVar6 = l_strcmp((TString *)(l->value_).gc,(TString *)(r->value_).gc);
      return uVar6 >> 0x1f;
    }
LAB_0012279d:
    iVar4 = luaT_callorderTM(L,l,r,TM_LT);
    if (-1 < iVar4) {
      return iVar4;
    }
    luaG_ordererror(L,l,r);
  }
  if ((uVar6 != 3) || (uVar6 = r->tt_, (uVar6 & 0xf) != 3)) goto LAB_0012279d;
  if (l->tt_ == 0x13) {
    lVar2 = (l->value_).i;
    if (uVar6 == 0x13) {
      lVar5 = (r->value_).i;
    }
    else {
      dVar1 = (r->value_).n;
      if (lVar2 + 0x20000000000000U < 0x40000000000001) {
        bVar3 = dVar1 == (double)lVar2;
        bVar7 = dVar1 < (double)lVar2;
        goto LAB_00122803;
      }
      bVar3 = true;
      if (9.223372036854776e+18 <= dVar1) goto LAB_0012288c;
      if (dVar1 <= -9.223372036854776e+18) goto LAB_0012287b;
      lVar5 = (long)dVar1;
    }
    bVar3 = lVar2 < lVar5;
  }
  else {
    dVar1 = (l->value_).n;
    if (uVar6 != 3) {
      if (!NAN(dVar1)) {
        lVar2 = (r->value_).i;
        if (lVar2 + 0x20000000000000U < 0x40000000000001) {
          bVar3 = (double)lVar2 <= dVar1;
        }
        else {
          bVar3 = true;
          if (dVar1 < 9.223372036854776e+18) {
            if (-9.223372036854776e+18 <= dVar1) {
              bVar3 = lVar2 <= (long)dVar1;
            }
            else {
              bVar3 = false;
            }
          }
        }
        bVar3 = (bool)(bVar3 ^ 1);
        goto LAB_0012288c;
      }
LAB_0012287b:
      bVar3 = false;
      goto LAB_0012288c;
    }
    bVar3 = (r->value_).n == dVar1;
    bVar7 = (r->value_).n < dVar1;
LAB_00122803:
    bVar3 = !bVar7 && !bVar3;
  }
LAB_0012288c:
  return (uint)bVar3;
}

Assistant:

int luaV_lessthan (lua_State *L, const TValue *l, const TValue *r) {
  int res;
  if (ttisnumber(l) && ttisnumber(r))  /* both operands are numbers? */
    return LTnum(l, r);
  else if (ttisstring(l) && ttisstring(r))  /* both are strings? */
    return l_strcmp(tsvalue(l), tsvalue(r)) < 0;
  else if ((res = luaT_callorderTM(L, l, r, TM_LT)) < 0)  /* no metamethod? */
    luaG_ordererror(L, l, r);  /* error */
  return res;
}